

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Vrc6.cpp
# Opt level: O0

void __thiscall Nes_Vrc6::run_until(Nes_Vrc6 *this,cpu_time_t time)

{
  long in_RSI;
  long in_RDI;
  cpu_time_t in_stack_00000020;
  Vrc6_Osc *in_stack_00000028;
  Nes_Vrc6 *in_stack_00000030;
  
  if (*(long *)(in_RDI + 0x60) <= in_RSI) {
    run_square(in_stack_00000030,in_stack_00000028,in_stack_00000020);
    run_square(in_stack_00000030,in_stack_00000028,in_stack_00000020);
    run_saw(in_stack_00000030,(cpu_time_t)in_stack_00000028);
    *(long *)(in_RDI + 0x60) = in_RSI;
    return;
  }
  __assert_fail("( \"unmet requirement\", time >= last_time )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fgssfgss[P]NESEmulator/apu_emu/nes_apu/Nes_Vrc6.cpp"
                ,0x42,"void Nes_Vrc6::run_until(cpu_time_t)");
}

Assistant:

void Nes_Vrc6::run_until( cpu_time_t time )
{
	require( time >= last_time );
	run_square( oscs [0], time );
	run_square( oscs [1], time );
	run_saw( time );
	last_time = time;
}